

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  ImDrawChannel *pIVar1;
  ImVector<ImDrawChannel> *this_00;
  int i;
  int i_00;
  
  ImVector<ImDrawCmd>::clear(&this->CmdBuffer);
  ImVector<unsigned_short>::clear(&this->IdxBuffer);
  ImVector<ImDrawVert>::clear(&this->VtxBuffer);
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ImVector<ImVec4>::clear(&this->_ClipRectStack);
  ImVector<void_*>::clear(&this->_TextureIdStack);
  ImVector<ImVec2>::clear(&this->_Path);
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  this_00 = &this->_Channels;
  for (i_00 = 0; i_00 < this_00->Size; i_00 = i_00 + 1) {
    if (i_00 == 0) {
      pIVar1 = ImVector<ImDrawChannel>::operator[](this_00,0);
      (pIVar1->CmdBuffer).Size = 0;
      (pIVar1->CmdBuffer).Capacity = 0;
      (pIVar1->CmdBuffer).Data = (ImDrawCmd *)0x0;
      (pIVar1->IdxBuffer).Size = 0;
      (pIVar1->IdxBuffer).Capacity = 0;
      (pIVar1->IdxBuffer).Data = (unsigned_short *)0x0;
    }
    pIVar1 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
    ImVector<ImDrawCmd>::clear(&pIVar1->CmdBuffer);
    pIVar1 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
    ImVector<unsigned_short>::clear(&pIVar1->IdxBuffer);
  }
  ImVector<ImDrawChannel>::clear(this_00);
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}